

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_1f65f7::fillPixels<unsigned_int>
               (Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *ph,int width,int height)

{
  long lVar1;
  uint *puVar2;
  ulong uVar3;
  uint **ppuVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong local_58;
  
  lVar6 = (long)width;
  uVar3 = height * lVar6;
  ppuVar4 = (uint **)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
  if (ph->_data != (uint **)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = lVar6;
  ph->_data = ppuVar4;
  if (0 < height) {
    lVar1 = sampleCount->_sizeY;
    local_58 = 0;
    do {
      if (0 < width) {
        lVar7 = lVar1 * local_58;
        uVar3 = 0;
        do {
          puVar5 = (uint *)operator_new__((ulong)sampleCount->_data[lVar7 + uVar3] << 2);
          ph->_data[local_58 * lVar6 + uVar3] = puVar5;
          puVar5 = sampleCount->_data;
          if (puVar5[lVar7 + uVar3] != 0) {
            puVar2 = ph->_data[local_58 * lVar6 + uVar3];
            uVar8 = 0;
            do {
              puVar2[uVar8] = (uint)((int)local_58 * width + (int)uVar3) % 0x801;
              uVar8 = uVar8 + 1;
            } while (uVar8 < puVar5[lVar7 + uVar3]);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != (uint)width);
      }
      local_58 = local_58 + 1;
    } while (local_58 != (uint)height);
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}